

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * __thiscall Div::forward(Div *this,vector<tensor_*,_std::allocator<tensor_*>_> *x,double q)

{
  tensor *ptVar1;
  tensor *ptVar2;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar2 = (tensor *)operator_new(0x20);
  ptVar2->data = 0.0;
  ptVar2->grad = 0.0;
  ptVar2->cnt = 0;
  ptVar2->cnt_free = 0;
  ptVar2->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  (this->super_node).ret = ptVar2;
  ptVar1 = *(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ptVar2->data = ptVar1->data / q;
  *(this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = 1.0 / q;
  ptVar1->cnt = ptVar1->cnt + 1;
  ptVar1->cnt_free = ptVar1->cnt_free + 1;
  ptVar2->hook = &this->super_node;
  return ptVar2;
}

Assistant:

tensor* forward(vector<tensor *> x, double q){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = input[0]->data/q;
        grad_fn[0]=1/q;
        input[0]->cnt++;
        input[0]->cnt_free++;
        ret->hook=this;
        return ret;
    }